

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O1

Uint64 __thiscall
Diligent::CommandQueueVkImpl::BindSparse(CommandQueueVkImpl *this,VkBindSparseInfo *InBindInfo)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppVVar2;
  SpinLock *this_00;
  Uint64 UVar3;
  SoftwareQueueIndex CommandQueueId;
  pointer ppVVar4;
  VkSemaphore_T *pVVar5;
  iterator iVar6;
  FenceVkImpl *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  undefined4 uVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  int iVar10;
  VkResult VVar11;
  SyncPointVk *this_03;
  VkBindSparseInfo *pVVar12;
  VkSemaphore_T **__args;
  long lVar13;
  ulong uVar14;
  NativeType *ppVVar15;
  byte bVar16;
  SyncPointVkPtr NewSyncPoint;
  string msg_1;
  VkBindSparseInfo BindInfo;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  pthread_mutex_t *local_d0;
  string local_c8;
  SyncPointVkPtr local_a8;
  Uint64 local_98;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80 [4];
  uint32_t local_40;
  pointer local_38;
  
  bVar16 = 0;
  local_d0 = (pthread_mutex_t *)&this->m_QueueMutex;
  iVar10 = pthread_mutex_lock(local_d0);
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  LOCK();
  paVar1 = &this->m_NextFenceValue;
  UVar3 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  this_03 = (SyncPointVk *)
            FixedBlockMemoryAllocator::Allocate
                      (&this->m_SyncPointAllocator,(ulong)this->m_NumCommandQueues * 0x20 + 0x38,
                       "SyncPointVk",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
                       ,0x8c);
  SyncPointVk::SyncPointVk
            (this_03,(SoftwareQueueIndex)(this->m_CommandQueueId).m_Value,
             (uint)this->m_NumCommandQueues,
             (this->m_SyncObjectManager).
             super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,((this->m_LogicalDevice).
                      super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->m_VkDevice,UVar3);
  std::__shared_ptr<Diligent::SyncPointVk,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Diligent::SyncPointVk,Diligent::CommandQueueVkImpl::CreateSyncPoint(unsigned_long)::_lambda(Diligent::SyncPointVk*)_1_,void>
            ((__shared_ptr<Diligent::SyncPointVk,(__gnu_cxx::_Lock_policy)2> *)&local_e8,this_03,
             (anon_class_8_1_0a24c139_for__M_tp)&this->m_SyncPointAllocator);
  peVar8 = local_e8;
  ppVVar4 = (this->m_TempSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_TempSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar4) {
    (this->m_TempSignalSemaphores).
    super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar4;
  }
  pVVar12 = InBindInfo;
  local_98 = UVar3;
  if (local_e8->m_NumSemaphores != '\0') {
    ppVVar15 = &local_e8->m_Semaphores[0].m_VkSyncObject;
    uVar14 = 0;
    do {
      pVVar5 = *ppVVar15;
      if (pVVar5 != (VkSemaphore_T *)0x0) {
        iVar6._M_current =
             (this->m_TempSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_90._0_8_ = pVVar5;
        if (iVar6._M_current ==
            (this->m_TempSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
          _M_realloc_insert<VkSemaphore_T*>
                    ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                     &this->m_TempSignalSemaphores,iVar6,(VkSemaphore_T **)local_90);
        }
        else {
          *iVar6._M_current = pVVar5;
          pppVVar2 = &(this->m_TempSignalSemaphores).
                      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppVVar2 = *pppVVar2 + 1;
        }
      }
      uVar14 = uVar14 + 1;
      ppVVar15 = ppVVar15 + 4;
    } while (uVar14 < peVar8->m_NumSemaphores);
  }
  do {
    pVVar12 = (VkBindSparseInfo *)pVVar12->pNext;
    if (pVVar12 == (VkBindSparseInfo *)0x0) goto LAB_00283e72;
  } while (pVVar12->sType != VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO);
  if ((this->m_TempSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_TempSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    FormatString<char[60]>
              ((string *)local_90,
               (char (*) [60])"Can not append semaphores when timeline semaphores are used");
    DebugAssertionFailed
              ((Char *)local_90._0_8_,"BindSparse",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0x137);
    if ((VkSemaphore_T *)local_90._0_8_ != (VkSemaphore_T *)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_,local_80[0]._M_allocated_capacity + 1);
    }
  }
LAB_00283e72:
  if (InBindInfo->signalSemaphoreCount != 0) {
    lVar13 = 0;
    uVar14 = 0;
    do {
      __args = (VkSemaphore_T **)((long)InBindInfo->pSignalSemaphores + lVar13);
      iVar6._M_current =
           (this->m_TempSignalSemaphores).
           super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->m_TempSignalSemaphores).
          super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
        _M_realloc_insert<VkSemaphore_T*const&>
                  ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                   &this->m_TempSignalSemaphores,iVar6,__args);
      }
      else {
        *iVar6._M_current = *__args;
        pppVVar2 = &(this->m_TempSignalSemaphores).
                    super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppVVar2 = *pppVVar2 + 1;
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 8;
    } while (uVar14 < InBindInfo->signalSemaphoreCount);
  }
  pVVar12 = (VkBindSparseInfo *)local_90;
  for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
    uVar7 = *(undefined4 *)&InBindInfo->field_0x4;
    pVVar12->sType = InBindInfo->sType;
    *(undefined4 *)&pVVar12->field_0x4 = uVar7;
    InBindInfo = (VkBindSparseInfo *)((long)InBindInfo + (ulong)bVar16 * -0x10 + 8);
    pVVar12 = (VkBindSparseInfo *)((long)pVVar12 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  local_38 = (this->m_TempSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_40 = (uint32_t)
             ((ulong)((long)(this->m_TempSignalSemaphores).
                            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_38) >> 3);
  VVar11 = (*vkQueueBindSparse)
                     (this->m_VkQueue,1,(VkBindSparseInfo *)local_90,
                      (local_e8->m_Fence).m_VkSyncObject);
  UVar3 = local_98;
  if (VVar11 != VK_SUCCESS) {
    FormatString<char[59]>
              (&local_c8,(char (*) [59])"Failed to submit sparse bind commands to the command queue"
              );
    DebugAssertionFailed
              (local_c8._M_dataplus._M_p,"BindSparse",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0x146);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_pFence).m_pObject == (FenceVkImpl *)0x0) {
    FormatString<char[45]>(&local_c8,(char (*) [45])"Command queue fence has not been initialized");
    DebugAssertionFailed
              (local_c8._M_dataplus._M_p,"BindSparse",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0x149);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  this_01 = (this->m_pFence).m_pObject;
  CommandQueueId.m_Value = (this->m_CommandQueueId).m_Value;
  local_a8.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_e8;
  local_a8.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_e0;
  if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_e0->_M_use_count = p_Stack_e0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_e0->_M_use_count = p_Stack_e0->_M_use_count + 1;
    }
  }
  FenceVkImpl::AddPendingSyncPoint(this_01,CommandQueueId,UVar3,&local_a8);
  if (local_a8.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this_00 = &this->m_LastSyncPointLock;
  LOCK();
  bVar16 = (this->m_LastSyncPointLock).m_IsLocked._M_base._M_i;
  (this->m_LastSyncPointLock).m_IsLocked._M_base._M_i = true;
  UNLOCK();
  while (p_Var9 = p_Stack_e0, peVar8 = local_e8, (bVar16 & 1) != 0) {
    Threading::SpinLock::Wait(this_00);
    LOCK();
    bVar16 = (this_00->m_IsLocked)._M_base._M_i;
    (this_00->m_IsLocked)._M_base._M_i = true;
    UNLOCK();
  }
  local_e8 = (element_type *)0x0;
  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_02 = (this->m_LastSyncPoint).
            super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_LastSyncPoint).super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar8;
  (this->m_LastSyncPoint).super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var9;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  Threading::SpinLock::unlock(this_00);
  if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
  }
  pthread_mutex_unlock(local_d0);
  return UVar3;
}

Assistant:

Uint64 CommandQueueVkImpl::BindSparse(const VkBindSparseInfo& InBindInfo)
{
    std::lock_guard<std::mutex> QueueGuard{m_QueueMutex};

    // Increment the value before submitting the buffer to be overly safe
    const uint64_t FenceValue = m_NextFenceValue.fetch_add(1);

    auto NewSyncPoint = CreateSyncPoint(FenceValue);

    m_TempSignalSemaphores.clear();
    NewSyncPoint->GetSemaphores(m_TempSignalSemaphores);

#ifdef DILIGENT_DEBUG
    const VkBaseInStructure* pStruct = static_cast<const VkBaseInStructure*>(InBindInfo.pNext);
    for (; pStruct != nullptr;)
    {
        if (pStruct->sType == VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO)
        {
            VERIFY(m_TempSignalSemaphores.empty(), "Can not append semaphores when timeline semaphores are used");
            break;
        }
        pStruct = pStruct->pNext;
    }
#endif

    for (uint32_t s = 0; s < InBindInfo.signalSemaphoreCount; ++s)
        m_TempSignalSemaphores.push_back(InBindInfo.pSignalSemaphores[s]);

    VkBindSparseInfo BindInfo     = InBindInfo;
    BindInfo.signalSemaphoreCount = static_cast<Uint32>(m_TempSignalSemaphores.size());
    BindInfo.pSignalSemaphores    = m_TempSignalSemaphores.data();

    auto err = vkQueueBindSparse(m_VkQueue, 1, &BindInfo, NewSyncPoint->GetFence());
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to submit sparse bind commands to the command queue");
    (void)err;

    VERIFY(m_pFence != nullptr, "Command queue fence has not been initialized");
    m_pFence->AddPendingSyncPoint(m_CommandQueueId, FenceValue, NewSyncPoint);

    // Update the last sync point
    {
        Threading::SpinLockGuard SyncPointGuard{m_LastSyncPointLock};
        m_LastSyncPoint = std::move(NewSyncPoint);
    }

    return FenceValue;
}